

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::AffixMatcherWarehouse
          (AffixMatcherWarehouse *this,AffixTokenMatcherWarehouse *tokenWarehouse)

{
  AffixPatternMatcher *local_50;
  AffixMatcherWarehouse *local_30;
  AffixTokenMatcherWarehouse *tokenWarehouse_local;
  AffixMatcherWarehouse *this_local;
  
  local_30 = this;
  do {
    AffixMatcher::AffixMatcher(local_30->fAffixMatchers);
    local_30 = (AffixMatcherWarehouse *)(local_30->fAffixMatchers + 1);
  } while (local_30 != (AffixMatcherWarehouse *)this->fAffixPatternMatchers);
  local_50 = this->fAffixPatternMatchers;
  do {
    AffixPatternMatcher::AffixPatternMatcher(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (AffixPatternMatcher *)&this->fTokenWarehouse);
  this->fTokenWarehouse = tokenWarehouse;
  return;
}

Assistant:

AffixMatcherWarehouse::AffixMatcherWarehouse(AffixTokenMatcherWarehouse* tokenWarehouse)
        : fTokenWarehouse(tokenWarehouse) {
}